

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flute_mst.c
# Opt level: O0

void collect_nodes(TreeNode *tn,dl_t nlist)

{
  dl_el_s *pdVar1;
  dl_el_s *pdVar2;
  dl_el *pdVar3;
  dl_el *_el_2;
  dl_t _curr_dl;
  dl_el *_next;
  dl_el *_el_1;
  dl_el *_el;
  dl_el *curr;
  TreeNode *c;
  dl_t nlist_local;
  TreeNode *tn_local;
  
  pdVar3 = (dl_el *)malloc(0x18);
  if (pdVar3 == (dl_el *)0x0) {
    printf("Out of memory!!\n");
  }
  else {
    pdVar3[1].prev = (dl_el_s *)tn;
    pdVar3->next = (dl_el_s *)0x0;
    if (nlist->count == 0) {
      pdVar3->prev = (dl_el_s *)0x0;
      nlist->last = pdVar3;
      nlist->first = pdVar3;
      nlist->count = 1;
    }
    else {
      pdVar3->prev = nlist->last;
      nlist->last->next = pdVar3;
      nlist->last = pdVar3;
      nlist->count = nlist->count + 1;
    }
  }
  for (_el = nlist->last; _el != (dl_el *)0x0; _el = _el->next) {
    _next = (_el[1].prev)->next->prev;
    while (_next != (dl_el *)0x0) {
      pdVar1 = _next->next;
      pdVar2 = _next[1].prev;
      pdVar3 = (dl_el *)malloc(0x18);
      _next = pdVar1;
      if (pdVar3 == (dl_el *)0x0) {
        printf("Out of memory!!\n");
      }
      else {
        pdVar3[1].prev = pdVar2;
        pdVar3->next = (dl_el_s *)0x0;
        if (nlist->count == 0) {
          pdVar3->prev = (dl_el_s *)0x0;
          nlist->last = pdVar3;
          nlist->first = pdVar3;
          nlist->count = 1;
        }
        else {
          pdVar3->prev = nlist->last;
          nlist->last->next = pdVar3;
          nlist->last = pdVar3;
          nlist->count = nlist->count + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void collect_nodes(TreeNode* tn, dl_t nlist)
{
  /*
  TreeNode* c;
  
  dl_append(TreeNode*, nlist, tn);
  dl_forall(TreeNode*, tn->children, c) {
    collect_nodes(c, nlist);
  }dl_endfor;
  */
  // non-recursive version
  TreeNode* c;
  dl_el *curr;
  
  dl_append(TreeNode*, nlist, tn);

  for (curr=nlist->last; curr; curr=curr->next) {
    tn = dl_data(TreeNode*, curr);
    dl_forall(TreeNode*, tn->children, c) {
      dl_append(TreeNode*, nlist, c);
    }dl_endfor;
  }
}